

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShower::setRgb(QColorShower *this,QRgb rgb)

{
  QRgb QVar1;
  uint in_ESI;
  QColorShower *in_RDI;
  long in_FS_OFFSET;
  QColSpinBox *text;
  int *in_stack_ffffffffffffff90;
  int i;
  QColSpinBox *this_00;
  QColSpinBox *in_stack_ffffffffffffff98;
  QColorShower *this_01;
  int *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  QColorShower *this_02;
  undefined1 local_30 [24];
  QColor local_18;
  long local_8;
  
  QVar1 = (QRgb)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->rgbOriginal = true;
  in_RDI->curCol = in_ESI;
  currentColor(in_RDI);
  rgb2hsv(QVar1,in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
         );
  i = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
  text = in_RDI->rEd;
  QVar1 = currentColor(in_RDI);
  qRed(QVar1);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,i);
  this_00 = in_RDI->gEd;
  QVar1 = currentColor(in_RDI);
  qGreen(QVar1);
  QColSpinBox::setValue(in_stack_ffffffffffffff98,(int)((ulong)this_00 >> 0x20));
  this_01 = (QColorShower *)in_RDI->bEd;
  QVar1 = currentColor(in_RDI);
  qBlue(QVar1);
  QColSpinBox::setValue((QColSpinBox *)this_01,(int)((ulong)this_00 >> 0x20));
  this_02 = (QColorShower *)in_RDI->htEd;
  QColor::QColor(&local_18,in_ESI);
  QColor::name((NameFormat)local_30);
  QLineEdit::setText((QLineEdit *)this_00,(QString *)text);
  QString::~QString((QString *)0x735d42);
  showCurrentColor(this_01);
  updateQColor(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::setRgb(QRgb rgb)
{
    rgbOriginal = true;
    curCol = rgb;

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(QColor(rgb).name());

    showCurrentColor();
    updateQColor();
}